

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
* __thiscall
fmt::v5::internal::
arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
::find(basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
       *__return_storage_ptr__,
      arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
      *this,basic_string_view<fmt::v5::char8_t> name)

{
  ulong uVar1;
  longlong lVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  ulong uVar6;
  entry *peVar7;
  entry *peVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar6 = name.size_;
  if ((ulong)this->size_ != 0) {
    peVar7 = this->map_;
    peVar8 = peVar7 + this->size_;
    do {
      uVar1 = (peVar7->name).size_;
      uVar9 = uVar6;
      if (uVar1 < uVar6) {
        uVar9 = uVar1;
      }
      if (uVar9 != 0) {
        uVar10 = 0;
        do {
          if (name.data_[uVar10] != (peVar7->name).data_[uVar10]) goto LAB_0021061e;
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      if (uVar1 == uVar6) {
        lVar2 = (peVar7->arg).value_.field_0.long_long_value;
        sVar3 = (peVar7->arg).value_.field_0.string.size;
        uVar5 = *(undefined4 *)&(peVar7->arg).field_0x14;
        uVar4 = *(undefined8 *)&(peVar7->arg).field_0x18;
        __return_storage_ptr__->type_ = (peVar7->arg).type_;
        *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar5;
        *(undefined8 *)&__return_storage_ptr__->field_0x18 = uVar4;
        (__return_storage_ptr__->value_).field_0.long_long_value = lVar2;
        (__return_storage_ptr__->value_).field_0.string.size = sVar3;
        return __return_storage_ptr__;
      }
LAB_0021061e:
      peVar7 = peVar7 + 1;
    } while (peVar7 != peVar8);
  }
  (__return_storage_ptr__->value_).field_0.int_value = 0;
  __return_storage_ptr__->type_ = none_type;
  return __return_storage_ptr__;
}

Assistant:

basic_format_arg<Context> find(basic_string_view<char_type> name) const {
    // The list is unsorted, so just return the first matching name.
    for (entry *it = map_, *end = map_ + size_; it != end; ++it) {
      if (it->name == name)
        return it->arg;
    }
    return {};
  }